

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DynamicSinglePixelOffsets::operator()
          (DynamicSinglePixelOffsets *this,IVec2 *pixCoord,IVec2 (*dst) [4])

{
  int iVar1;
  int iVar2;
  IVec2 *this_00;
  Vector<int,_2> local_78;
  Vector<int,_2> local_70;
  Vector<int,_2> local_68;
  tcu local_60 [8];
  tcu local_58 [8];
  MultiplePixelOffsets local_50;
  int local_24;
  IVec2 (*paIStack_20) [4];
  int offsetRangeSize;
  IVec2 (*dst_local) [4];
  IVec2 *pixCoord_local;
  DynamicSinglePixelOffsets *this_local;
  
  this_00 = &this->m_offsetRange;
  paIStack_20 = dst;
  dst_local = (IVec2 (*) [4])pixCoord;
  pixCoord_local = (IVec2 *)this;
  iVar1 = tcu::Vector<int,_2>::y(this_00);
  iVar2 = tcu::Vector<int,_2>::x(this_00);
  local_24 = (iVar1 - iVar2) + 1;
  tcu::Vector<int,_2>::swizzle(&local_68,(int)dst_local,1);
  tcu::Vector<int,_2>::Vector(&local_70,local_24);
  tcu::mod<int,2>(local_60,&local_68,&local_70);
  iVar1 = tcu::Vector<int,_2>::x(this_00);
  tcu::operator+(local_58,(Vector<int,_2> *)local_60,iVar1);
  SinglePixelOffsets::SinglePixelOffsets((SinglePixelOffsets *)&local_50,(IVec2 *)local_58);
  tcu::Vector<int,_2>::Vector(&local_78);
  MultiplePixelOffsets::operator()(&local_50,&local_78,paIStack_20);
  SinglePixelOffsets::~SinglePixelOffsets((SinglePixelOffsets *)&local_50);
  return;
}

Assistant:

void operator() (const IVec2& pixCoord, IVec2 (&dst)[4]) const
	{
		const int offsetRangeSize = m_offsetRange.y() - m_offsetRange.x() + 1;
		SinglePixelOffsets(tcu::mod(pixCoord.swizzle(1,0), IVec2(offsetRangeSize)) + m_offsetRange.x())(IVec2(), dst);
	}